

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linker.c
# Opt level: O3

Symbol * dyn_ext_entry(GlobalVars *gv,Symbol *xdef,Reloc *xref,int entrytype)

{
  uint8_t uVar1;
  Symbol *pSVar2;
  DynArg a;
  
  if ((entrytype == 2) && (xdef->relsect->obj->lnkfile->type != '\x04')) {
    if (xref->rtype == '\a') {
      uVar1 = '\x01';
    }
    else {
      if (xref->rtype != '\b') {
        return xdef;
      }
      uVar1 = '\x02';
    }
    xref->rtype = uVar1;
  }
  else {
    pSVar2 = dyn_entry(gv,(DynArg)xdef,entrytype);
    if (pSVar2 != (Symbol *)0x0) {
      return pSVar2;
    }
  }
  return xdef;
}

Assistant:

static struct Symbol *dyn_ext_entry(struct GlobalVars *gv,
                                    struct Symbol *xdef,struct Reloc *xref,
                                    int entrytype)
/* make a dyn_entry for an external reference */
{
  if (xdef->relsect->obj->lnkfile->type!=ID_SHAREDOBJ
      && entrytype==PLT_ENTRY) {
    /* resolve PLT relocation to a local function directly */
    switch (xref->rtype) {
      case R_PLT:
        xref->rtype = R_ABS;
        break;
      case R_PLTPC:
        xref->rtype = R_PC;
        break;
    }
  }
  else {
    DynArg a;
    struct Symbol *sym;

    a.sym = xdef;
    sym = dyn_entry(gv,a,entrytype);
    if (sym)
      return sym;
  }
  return xdef;
}